

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-101.cpp
# Opt level: O0

void __thiscall
baryonyx::itm::
solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
::decrease_preference
          (solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
           *this,row_iterator begin,row_iterator end,longdouble theta)

{
  type plVar1;
  longdouble theta_local;
  row_iterator end_local;
  row_iterator begin_local;
  solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
  *this_local;
  
  for (end_local = begin; end_local != end; end_local = end_local + 1) {
    plVar1 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                       (&this->P,(long)end_local->value);
    *plVar1 = *plVar1 * theta;
  }
  return;
}

Assistant:

void decrease_preference(sparse_matrix<int>::row_iterator begin,
                             sparse_matrix<int>::row_iterator end,
                             Float theta) noexcept
    {
        for (; begin != end; ++begin)
            P[begin->value] *= theta;
    }